

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZEqnArray<double>,_10>::~TPZManVector(TPZManVector<TPZEqnArray<double>,_10> *this)

{
  void *in_RDI;
  TPZManVector<TPZEqnArray<double>,_10> *unaff_retaddr;
  
  ~TPZManVector(unaff_retaddr);
  operator_delete(in_RDI,0x1f9c0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}